

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O3

Aig_Man_t *
Saig_ManPhaseAbstract
          (Aig_Man_t *p,Vec_Int_t *vInits,int nFrames,int nPref,int fIgnore,int fPrint,int fVerbose)

{
  uint uVar1;
  uint nLoop;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int iVar4;
  Saig_Tsim_t *p_00;
  Aig_Man_t *pAVar5;
  int fVerbose_00;
  uint nWords;
  char *__s;
  
  if (p->nRegs == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x393,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  if (p->nTruePis == 0) {
    __assert_fail("Saig_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x394,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  if (p->nTruePos == 0) {
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x395,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  p_00 = Saig_ManReachableTernary(p,vInits,fVerbose);
  if (p_00 == (Saig_Tsim_t *)0x0) {
    return (Aig_Man_t *)0x0;
  }
  pVVar2 = p_00->vStates;
  if ((long)pVVar2->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  uVar3 = Saig_TsiComputePrefix(p_00,(uint *)pVVar2->pArray[(long)pVVar2->nSize + -1],p_00->nWords);
  p_00->nPrefix = uVar3;
  p_00->nCycle = ~uVar3 + pVVar2->nSize;
  if ((int)uVar3 < nPref) {
    nPref = uVar3;
  }
  uVar3 = Saig_TsiCountNonXValuedRegisters(p_00,nPref);
  p_00->nNonXRegs = uVar3;
  if (fVerbose != 0) {
    uVar1 = p_00->nPrefix;
    nLoop = p_00->nCycle;
    nWords = uVar1;
    printf("Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n",(ulong)uVar1,
           (ulong)nLoop,(ulong)(uint)p->nRegs,(ulong)uVar3);
    if (((int)uVar3 < 100) && (p_00->vStates->nSize < 0x50)) {
      Saig_TsiPrintTraces(p_00,nWords,uVar1,nLoop);
    }
  }
  if (fPrint == 0) {
    if (nFrames < 2) {
      __s = "The number of frames is less than 2. Phase assignment is not performed.";
    }
    else if ((uint)nFrames < 0x101) {
      uVar1 = p_00->nCycle;
      if (uVar1 == 1) {
        __s = "The cycle of ternary states is trivial. Phase abstraction cannot be done.";
      }
      else {
        if ((int)uVar1 % nFrames != 0) {
          pAVar5 = (Aig_Man_t *)0x0;
          printf("The cycle (%d) is not modulo the number of frames (%d). Phase abstraction cannot be done.\n"
                 ,(ulong)uVar1,(ulong)(uint)nFrames);
          goto LAB_006f095c;
        }
        if (uVar3 != 0) {
          iVar4 = Saig_ManFindRegisters(p_00,nFrames,fIgnore,fVerbose);
          if (iVar4 == 0) {
            pAVar5 = (Aig_Man_t *)0x0;
            printf("There is no registers to abstract with %d frames.\n",(ulong)(uint)nFrames);
          }
          else {
            pAVar5 = Saig_ManPerformAbstraction(p_00,nFrames,fVerbose_00);
          }
          goto LAB_006f095c;
        }
        __s = "All registers have X-valued states. Phase abstraction cannot be done.";
      }
    }
    else {
      __s = "The number of frames is more than 256. Phase assignment is not performed.";
    }
  }
  else {
    __s = "Print-out finished. Phase assignment is not performed.";
  }
  puts(__s);
  pAVar5 = (Aig_Man_t *)0x0;
LAB_006f095c:
  Saig_TsiStop(p_00);
  return pAVar5;
}

Assistant:

Aig_Man_t * Saig_ManPhaseAbstract( Aig_Man_t * p, Vec_Int_t * vInits, int nFrames, int nPref, int fIgnore, int fPrint, int fVerbose )
{
    Aig_Man_t * pNew = NULL;
    Saig_Tsim_t * pTsi;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, vInits, fVerbose );
    if ( pTsi == NULL )
        return NULL;
    // derive information
    pTsi->nPrefix = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    pTsi->nCycle = Vec_PtrSize(pTsi->vStates) - 1 - pTsi->nPrefix;
    pTsi->nNonXRegs = Saig_TsiCountNonXValuedRegisters(pTsi, Abc_MinInt(pTsi->nPrefix,nPref));
    // print statistics
    if ( fVerbose )
    {
        printf( "Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n", 
            pTsi->nPrefix, pTsi->nCycle, p->nRegs, pTsi->nNonXRegs );
        if ( pTsi->nNonXRegs < 100 && Vec_PtrSize(pTsi->vStates) < 80 )
            Saig_TsiPrintTraces( pTsi, pTsi->nWords, pTsi->nPrefix, pTsi->nCycle );
    }
    if ( fPrint )
        printf( "Print-out finished. Phase assignment is not performed.\n" );
    else if ( nFrames < 2 )
        printf( "The number of frames is less than 2. Phase assignment is not performed.\n" );
    else if ( nFrames > 256 )
        printf( "The number of frames is more than 256. Phase assignment is not performed.\n" );
    else if ( pTsi->nCycle == 1 )
        printf( "The cycle of ternary states is trivial. Phase abstraction cannot be done.\n" );
    else if ( pTsi->nCycle % nFrames != 0 )
        printf( "The cycle (%d) is not modulo the number of frames (%d). Phase abstraction cannot be done.\n", pTsi->nCycle, nFrames );
    else if ( pTsi->nNonXRegs == 0 )
        printf( "All registers have X-valued states. Phase abstraction cannot be done.\n" );
    else if ( !Saig_ManFindRegisters( pTsi, nFrames, fIgnore, fVerbose ) )
        printf( "There is no registers to abstract with %d frames.\n", nFrames );
    else
        pNew = Saig_ManPerformAbstraction( pTsi, nFrames, fVerbose );
    Saig_TsiStop( pTsi );
    return pNew;
}